

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void PathBezierToCasteljau
               (ImVector<ImVec2> *path,float x1,float y1,float x2,float y2,float x3,float y3,
               float x4,float y4,float tess_tol,int level)

{
  int iVar1;
  ImVec2 *pIVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  while( true ) {
    fVar7 = x4 - x1;
    fVar8 = y4 - y1;
    fVar9 = (x2 - x4) * fVar8 - (y2 - y4) * fVar7;
    fVar10 = (x3 - x4) * fVar8 - (y3 - y4) * fVar7;
    uVar5 = -(uint)(-fVar9 <= fVar9);
    uVar6 = -(uint)(-fVar10 <= fVar10);
    fVar9 = (float)(~uVar6 & (uint)-fVar10 | (uint)fVar10 & uVar6) +
            (float)(~uVar5 & (uint)-fVar9 | (uint)fVar9 & uVar5);
    if (fVar9 * fVar9 < (fVar7 * fVar7 + fVar8 * fVar8) * tess_tol) {
      iVar1 = path->Capacity;
      if (path->Size == iVar1) {
        iVar4 = path->Size + 1;
        if (iVar1 == 0) {
          iVar3 = 8;
        }
        else {
          iVar3 = iVar1 / 2 + iVar1;
        }
        if (iVar4 < iVar3) {
          iVar4 = iVar3;
        }
        if (iVar1 < iVar4) {
          pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar4 << 3);
          if (path->Data != (ImVec2 *)0x0) {
            memcpy(pIVar2,path->Data,(long)path->Size << 3);
          }
          ImGui::MemFree(path->Data);
          path->Data = pIVar2;
          path->Capacity = iVar4;
        }
      }
      pIVar2 = path->Data;
      iVar1 = path->Size;
      path->Size = iVar1 + 1;
      pIVar2[iVar1].x = x4;
      pIVar2[iVar1].y = y4;
      return;
    }
    if (9 < level) break;
    fVar7 = (x1 + x2) * 0.5;
    fVar8 = (y1 + y2) * 0.5;
    fVar12 = (x2 + x3) * 0.5;
    fVar11 = (y2 + y3) * 0.5;
    x3 = (x3 + x4) * 0.5;
    y3 = (y3 + y4) * 0.5;
    fVar9 = (fVar7 + fVar12) * 0.5;
    fVar10 = (fVar8 + fVar11) * 0.5;
    x2 = (fVar12 + x3) * 0.5;
    y2 = (fVar11 + y3) * 0.5;
    fVar11 = (fVar9 + x2) * 0.5;
    fVar12 = (fVar10 + y2) * 0.5;
    level = level + 1;
    PathBezierToCasteljau(path,x1,y1,fVar7,fVar8,fVar9,fVar10,fVar11,fVar12,tess_tol,level);
    x1 = fVar11;
    y1 = fVar12;
  }
  return;
}

Assistant:

static void PathBezierToCasteljau(ImVector<ImVec2>* path, float x1, float y1, float x2, float y2, float x3, float y3, float x4, float y4, float tess_tol, int level)
{
    float dx = x4 - x1;
    float dy = y4 - y1;
    float d2 = ((x2 - x4) * dy - (y2 - y4) * dx);
    float d3 = ((x3 - x4) * dy - (y3 - y4) * dx);
    d2 = (d2 >= 0) ? d2 : -d2;
    d3 = (d3 >= 0) ? d3 : -d3;
    if ((d2+d3) * (d2+d3) < tess_tol * (dx*dx + dy*dy))
    {
        path->push_back(ImVec2(x4, y4));
    }
    else if (level < 10)
    {
        float x12 = (x1+x2)*0.5f,       y12 = (y1+y2)*0.5f;
        float x23 = (x2+x3)*0.5f,       y23 = (y2+y3)*0.5f;
        float x34 = (x3+x4)*0.5f,       y34 = (y3+y4)*0.5f;
        float x123 = (x12+x23)*0.5f,    y123 = (y12+y23)*0.5f;
        float x234 = (x23+x34)*0.5f,    y234 = (y23+y34)*0.5f;
        float x1234 = (x123+x234)*0.5f, y1234 = (y123+y234)*0.5f;

        PathBezierToCasteljau(path, x1,y1,        x12,y12,    x123,y123,  x1234,y1234, tess_tol, level+1);
        PathBezierToCasteljau(path, x1234,y1234,  x234,y234,  x34,y34,    x4,y4,       tess_tol, level+1);
    }
}